

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O2

bool __thiscall HighsLp::equalScaling(HighsLp *this,HighsLp *lp)

{
  int iVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  bool bVar12;
  
  iVar6 = (lp->scale_).strategy;
  iVar7 = (lp->scale_).num_row;
  iVar8 = (this->scale_).strategy;
  bVar4 = (this->scale_).has_scaling;
  bVar5 = (lp->scale_).has_scaling;
  iVar9 = (this->scale_).num_col;
  iVar1 = (lp->scale_).num_col;
  iVar10 = (this->scale_).num_row;
  dVar2 = (this->scale_).cost;
  dVar3 = (lp->scale_).cost;
  bVar11 = std::operator==(&(this->scale_).col,&(lp->scale_).col);
  bVar12 = std::operator==(&(this->scale_).row,&(lp->scale_).row);
  return ((((bVar12 && bVar11) && iVar10 == iVar7) && (iVar9 == iVar1 && bVar4 == bVar5)) &&
         iVar8 == iVar6) && dVar2 == dVar3;
}

Assistant:

bool HighsLp::equalScaling(const HighsLp& lp) const {
  bool equal = true;
  equal = this->scale_.strategy == lp.scale_.strategy && equal;
  equal = this->scale_.has_scaling == lp.scale_.has_scaling && equal;
  equal = this->scale_.num_col == lp.scale_.num_col && equal;
  equal = this->scale_.num_row == lp.scale_.num_row && equal;
  equal = this->scale_.cost == lp.scale_.cost && equal;
  equal = this->scale_.col == lp.scale_.col && equal;
  equal = this->scale_.row == lp.scale_.row && equal;
#ifndef NDEBUG
  if (!equal) printf("HighsLp::equalScaling: Unequal scaling\n");
#endif
  return equal;
}